

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedDynamicPaths::Run(AdvancedDynamicPaths *this)

{
  CallLogWrapper *this_00;
  float *pfVar1;
  float fVar2;
  bool bVar3;
  int i;
  GLuint GVar4;
  GLint GVar5;
  long lVar6;
  uint uVar7;
  bool *compile_error;
  int i_3;
  int i_2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  vec4 expected [4];
  float afStack_b4 [2];
  allocator_type local_a9;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  float afStack_70 [2];
  value_type local_68;
  float afStack_58 [4];
  float afStack_48 [4];
  float afStack_38 [6];
  
  local_a8 = (undefined1  [8])&local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,
             "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer Output {\n  vec4 g_output[4];\n};\nuniform isamplerBuffer g_path_buffer;\nuniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));\nuniform samplerBuffer g_input1;\nlayout(binding = 1, std430) buffer Input2 {\n  vec4[4] g_input2;\n};\n\nvoid Path2(int id) {\n  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));\n}\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  const int path = texelFetch(g_path_buffer, id).x;\n\n  if (path == 0) {\n    g_output[id] = g_input0[gl_LocalInvocationID.x];\n    memoryBarrier();\n  } else if (path == 1) {\n    return;\n  } else if (path == 2) {\n    Path2(id);\n    return;\n  } else if (path == 3) {\n    g_output[id] = g_input2[path - 1];\n    memoryBarrierBuffer();\n  }\n}"
             ,"");
  GVar4 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)local_a8)
  ;
  this->m_program = GVar4;
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar3 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar6 = -1;
  if (bVar3) {
    glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_buffer);
    glu::CallLogWrapper::glGenTextures(this_00,2,this->m_texture);
    lVar6 = 0;
    do {
      local_68.m_data[lVar6] = -100.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8,4,
               &local_68,&local_a9);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[0]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,(long)uStack_a0 - (long)local_a8,(void *)local_a8,0x88ea);
    if (local_a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity - (long)local_a8);
    }
    lVar6 = 0;
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x3f800000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar6 = 4;
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x40000000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar6 = 8;
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x40400000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xc);
    lVar6 = 0xc;
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x40800000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,local_a8,0x88ea);
    local_a8 = (undefined1  [8])0x200000003;
    uStack_a0 = (pointer)&DAT_00000001;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer[2]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x10,local_a8,0x88e4);
    lVar6 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8235,this->m_buffer[2]);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x41200000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar6 = 4;
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x41a00000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar6 = 8;
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x41f00000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xc);
    lVar6 = 0xc;
    do {
      *(undefined4 *)(local_a8 + lVar6 * 4) = 0x42200000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer[3]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x40,local_a8,0x88e4);
    lVar6 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_buffer[3]);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_path_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar5,0);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_input1");
    glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    local_78 = 0;
    afStack_70[0] = 0.0;
    afStack_70[1] = 0.0;
    local_88 = 0;
    uStack_80 = 0;
    local_98._M_allocated_capacity = 0;
    local_98._8_8_ = 0;
    local_a8 = (undefined1  [8])0x0;
    uStack_a0 = (pointer)0x0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer[0]);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x40,local_a8);
    do {
      local_68.m_data[lVar6] = 3.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar6 = 4;
    do {
      local_68.m_data[lVar6] = 20.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar6 = 8;
    do {
      local_68.m_data[lVar6] = -100.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xc);
    lVar6 = 0xc;
    do {
      local_68.m_data[lVar6] = 400.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    uVar7 = 0;
    bVar3 = true;
    lVar6 = 0xc;
    do {
      pfVar1 = (float *)((long)&local_78 + lVar6 + 4);
      if (((((*(float *)((long)afStack_b4 + lVar6) != *pfVar1) ||
            (NAN(*(float *)((long)afStack_b4 + lVar6)) || NAN(*pfVar1))) ||
           (fVar2 = *(float *)((long)afStack_b4 + lVar6 + 4),
           pfVar1 = (float *)((long)local_68.m_data + lVar6 + -8), fVar2 != *pfVar1)) ||
          ((NAN(fVar2) || NAN(*pfVar1) ||
           (pfVar1 = (float *)((long)local_68.m_data + lVar6 + -4),
           *(float *)(&stack0xffffffffffffff54 + lVar6) != *pfVar1)))) ||
         ((NAN(*(float *)(&stack0xffffffffffffff54 + lVar6)) || NAN(*pfVar1) ||
          ((pfVar1 = (float *)((long)local_68.m_data + lVar6),
           *(float *)(local_a8 + lVar6) != *pfVar1 ||
           (NAN(*(float *)(local_a8 + lVar6)) || NAN(*pfVar1))))))) {
        anon_unknown_0::Output("Invalid data at index %d.\n");
        break;
      }
      bVar3 = uVar7 < 3;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x4c);
    lVar6 = -(ulong)bVar3;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std140, binding = 0) buffer Output {" NL
			   "  vec4 g_output[4];" NL "};" NL "uniform isamplerBuffer g_path_buffer;" NL
			   "uniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));" NL
			   "uniform samplerBuffer g_input1;" NL "layout(binding = 1, std430) buffer Input2 {" NL
			   "  vec4[4] g_input2;" NL "};" NL NL "void Path2(int id) {" NL
			   "  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));" NL "}" NL "void main() {" NL
			   "  const int id = int(gl_GlobalInvocationID.x);" NL
			   "  const int path = texelFetch(g_path_buffer, id).x;" NL NL "  if (path == 0) {" NL
			   "    g_output[id] = g_input0[gl_LocalInvocationID.x];" NL "    memoryBarrier();" NL
			   "  } else if (path == 1) {" NL "    return;" NL "  } else if (path == 2) {" NL "    Path2(id);" NL
			   "    return;" NL "  } else if (path == 3) {" NL "    g_output[id] = g_input2[path - 1];" NL
			   "    memoryBarrierBuffer();" NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_buffer);
		glGenTextures(2, m_texture);

		/* init 'output' buffer */
		{
			std::vector<vec4> data(4, vec4(-100.0f));
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0],
						 GL_DYNAMIC_COPY);
		}
		/* init 'input2' buffer */
		{
			const vec4 data[4] = { vec4(1.0f), vec4(2.0f), vec4(3.0f), vec4(4.0f) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0][0], GL_DYNAMIC_COPY);
		}
		/* init 'path' buffer */
		{
			const int data[4] = { 3, 2, 1, 0 };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[2]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32I, m_buffer[2]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}
		/* init 'input1' buffer */
		{
			const vec4 data[4] = { vec4(10.0f), vec4(20.0f), vec4(30.0f), vec4(40.0f) };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[3]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer[3]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_path_buffer"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_input1"), 1);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate 'output' buffer */
		{
			vec4 data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0][0]);

			const vec4 expected[4] = { vec4(3.0f), vec4(20.0f), vec4(-100.0f), vec4(400.0f) };
			for (int i = 0; i < 4; ++i)
			{
				if (!IsEqual(data[i], expected[i]))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}